

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CodeGenRegVm_X86.cpp
# Opt level: O3

void ConvertPtrWrap(CodeGenRegVmStateContext *vmState,uint targetTypeId,uint sourceTypeId)

{
  CodeGenRegVmContext *pCVar1;
  CodeGenRegVmCallStackEntry *pCVar2;
  uint uVar3;
  char buf [1024];
  char acStack_428 [1032];
  
  pCVar1 = vmState->ctx;
  uVar3 = ConvertFromAutoRef(targetTypeId,sourceTypeId);
  if (uVar3 != 0) {
    return;
  }
  pCVar2 = vmState->callStackTop;
  pCVar2->instruction = vmState->callInstructionPos + 1;
  vmState->callStackTop = pCVar2 + 1;
  NULLC::SafeSprintf(acStack_428,0x400,"ERROR: cannot convert from %s ref to %s ref",
                     pCVar1->exSymbols + pCVar1->exTypes[sourceTypeId].offsetToName,
                     pCVar1->exSymbols + pCVar1->exTypes[targetTypeId].offsetToName);
  ExecutorX86::Stop(pCVar1->x86rvm,acStack_428);
  longjmp((__jmp_buf_tag *)vmState,1);
}

Assistant:

void ConvertPtrWrap(CodeGenRegVmStateContext *vmState, unsigned targetTypeId, unsigned sourceTypeId)
{
	CodeGenRegVmContext &ctx = *vmState->ctx;

	if(!ConvertFromAutoRef(targetTypeId, sourceTypeId))
	{
		vmState->callStackTop->instruction = vmState->callInstructionPos + 1;
		vmState->callStackTop++;

		const unsigned bufSize = 1024;
		char buf[bufSize];

		NULLC::SafeSprintf(buf, bufSize, "ERROR: cannot convert from %s ref to %s ref", &ctx.exSymbols[ctx.exTypes[sourceTypeId].offsetToName], &ctx.exSymbols[ctx.exTypes[targetTypeId].offsetToName]);

		ctx.x86rvm->Stop(buf);

		longjmp(vmState->errorHandler, 1);
	}
}